

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O2

int SUNLinSolSolve_Band(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  void *pvVar1;
  sunrealtype **ppsVar2;
  undefined8 uVar3;
  
  N_VScale(0x3ff0000000000000,b,x);
  ppsVar2 = SUNBandMatrix_Cols(A);
  uVar3 = N_VGetArrayPointer(x);
  pvVar1 = A->content;
  SUNDlsMat_bandGBTRS(ppsVar2,*(undefined8 *)((long)pvVar1 + 8),*(undefined8 *)((long)pvVar1 + 0x28)
                      ,*(undefined8 *)((long)pvVar1 + 0x20),*(undefined8 *)((long)S->content + 8),
                      uVar3);
  *(undefined8 *)((long)S->content + 0x10) = 0;
  return 0;
}

Assistant:

int SUNLinSolSolve_Band(SUNLinearSolver S, SUNMatrix A, N_Vector x, N_Vector b,
                        SUNDIALS_MAYBE_UNUSED sunrealtype tol)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype **A_cols, *xdata;
  sunindextype* pivots;

  /* copy b into x */
  N_VScale(ONE, b, x);
  SUNCheckLastErr();

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata  = NULL;
  pivots = NULL;
  A_cols = SUNBandMatrix_Cols(A);
  SUNCheckLastErr();
  xdata = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  pivots = PIVOTS(S);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);

  /* solve using LU factors */
  SUNDlsMat_bandGBTRS(A_cols, SM_COLUMNS_B(A), SM_SUBAND_B(A), SM_LBAND_B(A),
                      pivots, xdata);
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}